

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O0

void libtorrent::apply_pack_impl
               (settings_pack *pack,session_settings_single_thread *sett,
               vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
               *callbacks)

{
  ushort uVar1;
  bool bVar2;
  __type_conflict1 _Var3;
  int iVar4;
  string *__lhs;
  bool local_15b;
  bool local_15a;
  bool local_159;
  __normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
  local_140;
  offset_in_session_impl_to_subr *local_138;
  __normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
  local_130;
  __normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
  local_128;
  value_type *local_120;
  bool_setting_entry_t *sa_2;
  reference ppStack_110;
  int index_2;
  pair<unsigned_short,_bool> *p_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
  *__range1_2;
  offset_in_session_impl_to_subr *local_e8;
  __normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
  local_e0;
  __normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
  local_d8;
  value_type *local_d0;
  int_setting_entry_t *sa_1;
  reference ppStack_c0;
  int index_1;
  pair<unsigned_short,_int> *p_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
  *__range1_1;
  offset_in_session_impl_to_subr *local_98;
  __normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
  local_90;
  __normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
  local_88;
  value_type *local_80;
  str_setting_entry_t *sa;
  string local_68;
  uint local_44;
  reference ppStack_40;
  int index;
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
  *callbacks_local;
  session_settings_single_thread *sett_local;
  settings_pack *pack_local;
  
  __end1 = ::std::
           vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&pack->m_strings);
  p = (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)::std::
         vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&pack->m_strings);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&p), bVar2) {
    ppStack_40 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator*(&__end1);
    if (((ppStack_40->first & 0xc000) == 0) &&
       (local_44 = ppStack_40->first & 0x3fff, local_44 < 0xd)) {
      __lhs = aux::session_settings_single_thread::get_str_abi_cxx11_(sett,(uint)ppStack_40->first);
      _Var3 = ::std::operator==(__lhs,&ppStack_40->second);
      if (!_Var3) {
        uVar1 = ppStack_40->first;
        ::std::__cxx11::string::string((string *)&local_68,(string *)&ppStack_40->second);
        aux::session_settings_single_thread::set_str(sett,(uint)uVar1,&local_68);
        ::std::__cxx11::string::~string((string *)&local_68);
        local_80 = aux::
                   container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                   ::operator[]((container_wrapper<libtorrent::str_setting_entry_t,_long,_std::array<libtorrent::str_setting_entry_t,_13UL>_>
                                 *)(anonymous_namespace)::str_settings,(long)(int)local_44);
        local_159 = false;
        if ((local_80->fun != 0) &&
           (local_159 = false,
           callbacks !=
           (vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
            *)0x0)) {
          local_90._M_current =
               (offset_in_session_impl_to_subr *)
               ::std::
               vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
               ::begin(callbacks);
          local_98 = (offset_in_session_impl_to_subr *)
                     ::std::
                     vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                     ::end(callbacks);
          local_88 = ::std::
                     find<__gnu_cxx::__normal_iterator<void(libtorrent::aux::session_impl::**)(),std::vector<void(libtorrent::aux::session_impl::*)(),std::allocator<void(libtorrent::aux::session_impl::*)()>>>,void(libtorrent::aux::session_impl::*)()>
                               (local_90,(__normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
                                          )local_98,&local_80->fun);
          __range1_1 = (vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                        *)::std::
                          vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                          ::end(callbacks);
          local_159 = __gnu_cxx::operator==
                                (&local_88,
                                 (__normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
                                  *)&__range1_1);
        }
        if (local_159 != false) {
          ::std::
          vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
          ::push_back(callbacks,&local_80->fun);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = ::std::
             vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
             ::begin(&pack->m_ints);
  p_1 = (pair<unsigned_short,_int> *)
        ::std::
        vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>::
        end(&pack->m_ints);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
                             *)&p_1), bVar2) {
    ppStack_c0 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
                 ::operator*(&__end1_1);
    if ((((ppStack_c0->first & 0xc000) == 0x4000) &&
        (sa_1._4_4_ = ppStack_c0->first & 0x3fff, sa_1._4_4_ < 0x9f)) &&
       (iVar4 = aux::session_settings_single_thread::get_int(sett,(uint)ppStack_c0->first),
       iVar4 != ppStack_c0->second)) {
      aux::session_settings_single_thread::set_int(sett,(uint)ppStack_c0->first,ppStack_c0->second);
      local_d0 = aux::
                 container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                 ::operator[]((container_wrapper<libtorrent::int_setting_entry_t,_long,_std::array<libtorrent::int_setting_entry_t,_159UL>_>
                               *)(anonymous_namespace)::int_settings,(long)(int)sa_1._4_4_);
      local_15a = false;
      if ((local_d0->fun != 0) &&
         (local_15a = false,
         callbacks !=
         (vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
          *)0x0)) {
        local_e0._M_current =
             (offset_in_session_impl_to_subr *)
             ::std::
             vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
             ::begin(callbacks);
        local_e8 = (offset_in_session_impl_to_subr *)
                   ::std::
                   vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                   ::end(callbacks);
        local_d8 = ::std::
                   find<__gnu_cxx::__normal_iterator<void(libtorrent::aux::session_impl::**)(),std::vector<void(libtorrent::aux::session_impl::*)(),std::allocator<void(libtorrent::aux::session_impl::*)()>>>,void(libtorrent::aux::session_impl::*)()>
                             (local_e0,(__normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
                                        )local_e8,&local_d0->fun);
        __range1_2 = (vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                      *)::std::
                        vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                        ::end(callbacks);
        local_15a = __gnu_cxx::operator==
                              (&local_d8,
                               (__normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
                                *)&__range1_2);
      }
      if (local_15a != false) {
        ::std::
        vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
        ::push_back(callbacks,&local_d0->fun);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_short,_int>_*,_std::vector<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = ::std::
             vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
             ::begin(&pack->m_bools);
  p_2 = (pair<unsigned_short,_bool> *)
        ::std::
        vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>::
        end(&pack->m_bools);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<const_std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
                             *)&p_2), bVar2) {
    ppStack_110 = __gnu_cxx::
                  __normal_iterator<const_std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
                  ::operator*(&__end1_2);
    if ((((ppStack_110->first & 0xc000) == 0x8000) &&
        (sa_2._4_4_ = ppStack_110->first & 0x3fff, sa_2._4_4_ < 0x54)) &&
       (bVar2 = aux::session_settings_single_thread::get_bool(sett,(uint)ppStack_110->first),
       bVar2 != (bool)(ppStack_110->second & 1U))) {
      aux::session_settings_single_thread::set_bool
                (sett,(uint)ppStack_110->first,(bool)(ppStack_110->second & 1));
      local_120 = aux::
                  container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                  ::operator[]((container_wrapper<libtorrent::bool_setting_entry_t,_long,_std::array<libtorrent::bool_setting_entry_t,_84UL>_>
                                *)(anonymous_namespace)::bool_settings,(long)(int)sa_2._4_4_);
      local_15b = false;
      if ((local_120->fun != 0) &&
         (local_15b = false,
         callbacks !=
         (vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
          *)0x0)) {
        local_130._M_current =
             (offset_in_session_impl_to_subr *)
             ::std::
             vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
             ::begin(callbacks);
        local_138 = (offset_in_session_impl_to_subr *)
                    ::std::
                    vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
                    ::end(callbacks);
        local_128 = ::std::
                    find<__gnu_cxx::__normal_iterator<void(libtorrent::aux::session_impl::**)(),std::vector<void(libtorrent::aux::session_impl::*)(),std::allocator<void(libtorrent::aux::session_impl::*)()>>>,void(libtorrent::aux::session_impl::*)()>
                              (local_130,
                               (__normal_iterator<void_(libtorrent::aux::session_impl::**)(),_std::vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>_>
                                )local_138,&local_120->fun);
        local_140._M_current =
             (offset_in_session_impl_to_subr *)
             ::std::
             vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
             ::end(callbacks);
        local_15b = __gnu_cxx::operator==(&local_128,&local_140);
      }
      if (local_15b != false) {
        ::std::
        vector<void_(libtorrent::aux::session_impl::*)(),_std::allocator<void_(libtorrent::aux::session_impl::*)()>_>
        ::push_back(callbacks,&local_120->fun);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_short,_bool>_*,_std::vector<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>_>
    ::operator++(&__end1_2);
  }
  return;
}

Assistant:

void apply_pack_impl(settings_pack const* pack, aux::session_settings_single_thread& sett
		, std::vector<void(aux::session_impl::*)()>* callbacks)
	{
		for (auto const& p : pack->m_strings)
		{
			// disregard setting indices that are not string types
			if ((p.first & settings_pack::type_mask) != settings_pack::string_type_base)
				continue;

			// ignore settings that are out of bounds
			int const index = p.first & settings_pack::index_mask;
			TORRENT_ASSERT_PRECOND(index >= 0 && index < settings_pack::num_string_settings);
			if (index < 0 || index >= settings_pack::num_string_settings)
				continue;

			// if the value did not change, don't call the update callback
			if (sett.get_str(p.first) == p.second) continue;

			sett.set_str(p.first, p.second);
			str_setting_entry_t const& sa = str_settings[index];

			if (sa.fun && callbacks
				&& std::find(callbacks->begin(), callbacks->end(), sa.fun) == callbacks->end())
				callbacks->push_back(sa.fun);
		}

		for (auto const& p : pack->m_ints)
		{
			// disregard setting indices that are not int types
			if ((p.first & settings_pack::type_mask) != settings_pack::int_type_base)
				continue;

			// ignore settings that are out of bounds
			int const index = p.first & settings_pack::index_mask;
			TORRENT_ASSERT_PRECOND(index >= 0 && index < settings_pack::num_int_settings);
			if (index < 0 || index >= settings_pack::num_int_settings)
				continue;

			// if the value did not change, don't call the update callback
			if (sett.get_int(p.first) == p.second) continue;

			sett.set_int(p.first, p.second);
			int_setting_entry_t const& sa = int_settings[index];
			if (sa.fun && callbacks
				&& std::find(callbacks->begin(), callbacks->end(), sa.fun) == callbacks->end())
				callbacks->push_back(sa.fun);
		}

		for (auto const& p : pack->m_bools)
		{
			// disregard setting indices that are not bool types
			if ((p.first & settings_pack::type_mask) != settings_pack::bool_type_base)
				continue;

			// ignore settings that are out of bounds
			int const index = p.first & settings_pack::index_mask;
			TORRENT_ASSERT_PRECOND(index >= 0 && index < settings_pack::num_bool_settings);
			if (index < 0 || index >= settings_pack::num_bool_settings)
				continue;

			// if the value did not change, don't call the update callback
			if (sett.get_bool(p.first) == p.second) continue;

			sett.set_bool(p.first, p.second);
			bool_setting_entry_t const& sa = bool_settings[index];
			if (sa.fun && callbacks
				&& std::find(callbacks->begin(), callbacks->end(), sa.fun) == callbacks->end())
				callbacks->push_back(sa.fun);
		}
	}